

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase230::run(TestCase230 *this)

{
  IndexingIterator<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Builder,_capnp::schema::Field::Builder>
  local_880;
  Builder root;
  Builder field;
  Builder local_818;
  SchemaLoader loader;
  Builder type;
  Builder fields;
  MallocMessageBuilder schemaBuilder;
  NullableValue<kj::Exception> local_518;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  NullableValue<kj::Exception> local_1c8;
  
  SchemaLoader::SchemaLoader(&loader);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestListDefaults>
            (&loader);
  MallocMessageBuilder::MallocMessageBuilder(&schemaBuilder,0x400,GROW_HEURISTICALLY);
  root._builder.segment = (SegmentBuilder *)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto((Reader *)&fields,(Schema *)&root);
  MessageBuilder::setRoot<capnp::schema::Node::Reader>
            (&schemaBuilder.super_MessageBuilder,(Reader *)&fields);
  MessageBuilder::getRoot<capnp::schema::Node>(&root,&schemaBuilder.super_MessageBuilder);
  *(undefined8 *)root._builder.data = 0xa851ad32cbc2ffea;
  if (*(short *)((long)root._builder.data + 0xc) == 1) {
    field._builder.dataSize = root._builder.dataSize;
    field._builder.pointerCount = root._builder.pointerCount;
    field._builder._38_2_ = root._builder._38_2_;
    field._builder.data = root._builder.data;
    field._builder.pointers = root._builder.pointers;
    field._builder.segment = root._builder.segment;
    field._builder.capTable = root._builder.capTable;
    capnp::schema::Node::Struct::Builder::getFields(&fields,(Builder *)&field);
    local_880.container = &fields;
    for (local_880.index = 0; local_880.index != fields.builder.elementCount;
        local_880.index = local_880.index + 1) {
      IndexingIterator<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Builder,_capnp::schema::Field::Builder>
      ::operator*(&field,&local_880);
      if (*(short *)((long)field._builder.data + 8) == 0) {
        local_818._builder.dataSize = field._builder.dataSize;
        local_818._builder.pointerCount = field._builder.pointerCount;
        local_818._builder._38_2_ = field._builder._38_2_;
        local_818._builder.data = field._builder.data;
        local_818._builder.pointers = field._builder.pointers;
        local_818._builder.segment = field._builder.segment;
        local_818._builder.capTable = field._builder.capTable;
        capnp::schema::Field::Slot::Builder::getType(&type,&local_818);
        if ((*type._builder.data == 0x10) &&
           (*(long *)((long)type._builder.data + 8) == -0x5f570ceb47f49c03)) {
          *(undefined8 *)((long)type._builder.data + 8) = 0xa851ad32cbc2ffea;
        }
      }
    }
  }
  StructBuilder::asReader(&root._builder);
  SchemaLoader::load(&loader,(Reader *)&fields);
  MallocMessageBuilder::~MallocMessageBuilder(&schemaBuilder);
  local_518.isSet = false;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&local_1c8,(Maybe<kj::Exception> *)&local_518);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition,(DebugExpression<kj::Maybe<kj::Exception>> *)&local_1c8,(None *)&kj::none
            );
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1c8);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_518);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xea,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != kj::none\", _kjCondition"
               ,(char (*) [154])
                "failed: expected kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != kj::none"
               ,&_kjCondition);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Incompatible) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<test::TestListDefaults>();
  EXPECT_NONFATAL_FAILURE(
      loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()));
}